

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O0

dict_match * __thiscall
lzham::search_accelerator::find_matches(search_accelerator *this,uint lookahead_ofs,bool spin)

{
  int iVar1;
  int iVar2;
  uint i;
  long *plVar3;
  dict_match *pdVar4;
  byte in_DL;
  int in_ESI;
  long in_RDI;
  scoped_perf_section sect;
  uint cMaxSpinCount;
  uint spin_count;
  int match_ref;
  uint match_ref_ofs;
  uint in_stack_ffffffffffffffd4;
  uint local_24;
  
  iVar1 = *(int *)(in_RDI + 0x24);
  iVar2 = *(int *)(in_RDI + 0x3d8);
  local_24 = 0;
  while( true ) {
    plVar3 = vector<long>::operator[]((vector<long> *)(in_RDI + 0x90),(iVar1 - iVar2) + in_ESI);
    i = (uint)*plVar3;
    if (i == 0xfffffffe) {
      return (dict_match *)0x0;
    }
    if (i != 0xffffffff) break;
    local_24 = local_24 + 1;
    if (((in_DL & 1) == 0) || (999 < local_24)) {
      scoped_perf_section::scoped_perf_section
                ((scoped_perf_section *)&stack0xffffffffffffffd7,"find_matches_sleep");
      local_24 = 1000;
      lzham_sleep(in_stack_ffffffffffffffd4);
    }
  }
  pdVar4 = vector<lzham::dict_match>::operator[]((vector<lzham::dict_match> *)(in_RDI + 0x78),i);
  return pdVar4;
}

Assistant:

dict_match* search_accelerator::find_matches(uint lookahead_ofs, bool spin)
   {
      LZHAM_ASSERT(lookahead_ofs < m_lookahead_size);

      const uint match_ref_ofs = static_cast<uint>(m_lookahead_pos - m_fill_lookahead_pos + lookahead_ofs);

      int match_ref;
      uint spin_count = 0;

      // This may spin until the match finder job(s) catch up to the caller's lookahead position.
      for ( ; ; )
      {
         match_ref = static_cast<int>(m_match_refs[match_ref_ofs]);
         if (match_ref == -2)
            return NULL;
         else if (match_ref != -1)
            break;

         spin_count++;
         const uint cMaxSpinCount = 1000;
         if ((spin) && (spin_count < cMaxSpinCount))
         {
            lzham_yield_processor();
            lzham_yield_processor();
            lzham_yield_processor();
            lzham_yield_processor();
            lzham_yield_processor();
            lzham_yield_processor();
            lzham_yield_processor();
            lzham_yield_processor();

            LZHAM_MEMORY_IMPORT_BARRIER
         }
         else
         {
            scoped_perf_section sect("find_matches_sleep");

            spin_count = cMaxSpinCount;

            lzham_sleep(1);
         }
      }

      LZHAM_MEMORY_IMPORT_BARRIER

      return &m_matches[match_ref];
   }